

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

string * __thiscall
spectest::JSONParser::CreateModulePath_abi_cxx11_
          (string *__return_storage_ptr__,JSONParser *this,string_view filename)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  char *pcVar5;
  size_type sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  string s_1;
  string s;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  ulong uVar12;
  
  pcVar5 = filename._M_str;
  uVar1 = (this->loc_).filename._M_len;
  pcVar2 = (this->loc_).filename._M_str;
  uVar7 = uVar1;
  if (uVar1 == 0) {
    uVar11 = 0;
    uVar7 = 0;
  }
  else {
    do {
      uVar9 = uVar7 - 1;
      uVar12 = uVar1;
      if (uVar7 == 0) {
        uVar9 = 0xffffffffffffffff;
        break;
      }
      lVar8 = uVar7 - 1;
      uVar7 = uVar9;
    } while (pcVar2[lVar8] != '/');
    do {
      uVar11 = uVar12 - 1;
      if (uVar12 == 0) {
        uVar11 = 0;
        uVar7 = uVar9;
        if (uVar9 == 0xffffffffffffffff) {
          uVar7 = uVar11;
        }
        goto LAB_001227c6;
      }
      lVar8 = uVar12 - 1;
      uVar12 = uVar11;
    } while (pcVar2[lVar8] != '\\');
    uVar7 = 0;
    if (uVar9 != 0xffffffffffffffff) {
      uVar7 = uVar9;
    }
  }
LAB_001227c6:
  if (uVar11 < uVar7) {
    uVar11 = uVar7;
  }
  if (uVar1 < uVar11) {
    uVar11 = uVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (uVar11 == 0) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar5,pcVar5 + filename._M_len);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    if (local_70 == &local_60) goto LAB_001228f8;
    lVar8 = CONCAT71(uStack_5f,local_60);
    puVar10 = local_70;
  }
  else {
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    std::__cxx11::string::reserve((ulong)&local_50);
    std::__cxx11::string::append((char *)&local_50,(ulong)pcVar2);
    std::__cxx11::string::append((char *)&local_50,0x18f6da);
    puVar10 = local_50;
    local_68 = 0;
    local_60 = 0;
    local_70 = &local_60;
    std::__cxx11::string::reserve((ulong)&local_70);
    std::__cxx11::string::append((char *)&local_70,(ulong)puVar10);
    std::__cxx11::string::append((char *)&local_70,(ulong)pcVar5);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if (local_50 == &local_40) goto LAB_001228f8;
    lVar8 = CONCAT71(uStack_3f,local_40);
    puVar10 = local_50;
  }
  operator_delete(puVar10,lVar8 + 1);
LAB_001228f8:
  sVar3 = __return_storage_ptr__->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      if (pcVar4[sVar6] == '\\') {
        pcVar4[sVar6] = '/';
      }
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSONParser::CreateModulePath(std::string_view filename) {
  std::string_view spec_json_filename = loc_.filename;
  std::string_view dirname = GetDirname(spec_json_filename);
  std::string path;

  if (dirname.size() == 0) {
    path = std::string(filename);
  } else {
    path = dirname + "/" + filename;
  }

  ConvertBackslashToSlash(&path);
  return path;
}